

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrogram.cpp
# Opt level: O0

int __thiscall
ncnn::Spectrogram::forward(Spectrogram *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  void *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar2;
  float fVar3;
  float fVar4;
  __type _Var5;
  double dVar6;
  float *outptr_2;
  float *ptr_2;
  int j_1;
  float *outptr_1;
  float *ptr_1;
  int i_1;
  float norm_1;
  float norm;
  double angle;
  float v;
  int k;
  float im;
  float re;
  int j;
  float *outptr;
  float *ptr;
  int i;
  size_t elemsize;
  int freqs;
  int freqs_onesided;
  int frames;
  int size;
  Option opt_b;
  Mat bottom_blob_bordered;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff9a8;
  Allocator *in_stack_fffffffffffff9b0;
  size_t in_stack_fffffffffffff9b8;
  void **ppvVar7;
  Mat *in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9c8;
  Mat *in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  undefined8 in_stack_fffffffffffff9e0;
  Mat *in_stack_fffffffffffff9e8;
  Mat *in_stack_fffffffffffff9f0;
  int in_stack_fffffffffffffa00;
  Option *in_stack_fffffffffffffa08;
  float *local_5a0;
  int local_55c;
  int local_52c;
  undefined8 local_528;
  undefined8 local_520;
  undefined8 local_518;
  undefined4 local_510;
  long local_508;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined8 local_4e8;
  undefined4 *local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined8 local_4c8;
  undefined4 local_4c0;
  long local_4b8;
  undefined4 local_4b0;
  undefined4 local_4ac;
  undefined4 local_4a8;
  undefined4 local_4a4;
  undefined4 local_4a0;
  undefined8 local_498;
  undefined4 *local_490;
  int local_484;
  float local_480;
  float local_47c;
  double local_478;
  float local_470;
  int local_46c;
  float local_468;
  float local_464;
  int local_460;
  char local_459;
  float *local_458;
  int *local_450;
  ulong local_448;
  undefined4 local_440;
  long *local_438;
  int local_430;
  int local_42c;
  int local_428;
  undefined4 local_424;
  undefined4 local_420;
  ulong local_418;
  float *local_410;
  void *local_408;
  int local_400;
  undefined4 local_3fc;
  long local_3f8;
  int local_3ec;
  int local_3e8;
  int local_3e4;
  int local_3e0;
  undefined1 local_3d0 [8];
  undefined8 local_3c8;
  void *local_390;
  int *local_388;
  long local_380;
  undefined4 local_378;
  long *local_370;
  undefined4 local_368;
  int local_364;
  undefined4 local_360;
  undefined4 local_35c;
  undefined4 local_358;
  long local_350;
  void *local_348;
  long *local_340;
  int local_324;
  undefined8 *local_320;
  float **local_318;
  void **local_308;
  long *local_300;
  undefined8 *local_2f8;
  void **local_2f0;
  undefined1 local_2e5;
  int local_2e4;
  undefined8 *local_2d8;
  undefined1 local_2cd;
  int local_2cc;
  undefined8 *local_2c0;
  undefined1 local_2b5;
  int local_2b4;
  float **local_2a8;
  int local_29c;
  long *local_298;
  int local_28c;
  long *local_288;
  int local_27c;
  long *local_278;
  float **local_258;
  undefined8 *local_248;
  undefined8 *local_238;
  void **local_228;
  long local_218;
  long *local_210;
  long local_208;
  long *local_200;
  int local_1f8;
  undefined4 local_1f4;
  void **local_1f0;
  long *local_1e8;
  long *local_1e0;
  undefined4 local_1d4;
  ulong local_1d0;
  float *local_1c8;
  undefined4 local_1bc;
  int local_1b8;
  int local_1b4;
  float **local_1b0;
  long local_1a8;
  undefined4 local_19c;
  long local_198;
  undefined4 *local_190;
  undefined4 local_184;
  int local_180;
  int local_17c;
  undefined8 *local_178;
  long local_170;
  undefined4 local_164;
  long local_160;
  undefined4 *local_158;
  undefined4 local_14c;
  int local_148;
  int local_144;
  undefined8 *local_140;
  undefined4 local_134;
  long local_130;
  undefined4 local_124;
  long local_120;
  undefined4 local_114;
  long local_110;
  int local_f8;
  undefined4 local_f4;
  void **local_f0;
  undefined8 *local_d0;
  undefined8 *local_b0;
  int local_98;
  undefined4 local_94;
  float **local_90;
  float *local_40;
  void *local_10;
  
  local_308 = &local_390;
  local_390 = (void *)*in_RSI;
  local_388 = (int *)in_RSI[1];
  local_380 = in_RSI[2];
  local_378 = (undefined4)in_RSI[3];
  local_370 = (long *)in_RSI[4];
  local_368 = (undefined4)in_RSI[5];
  local_364 = *(int *)((long)in_RSI + 0x2c);
  local_360 = (undefined4)in_RSI[6];
  local_35c = *(undefined4 *)((long)in_RSI + 0x34);
  local_358 = (undefined4)in_RSI[7];
  local_350 = in_RSI[8];
  if (local_388 != (int *)0x0) {
    local_1f4 = 1;
    LOCK();
    local_1f8 = *local_388;
    *local_388 = *local_388 + 1;
    UNLOCK();
  }
  local_340 = in_RDX;
  local_1f0 = local_308;
  if (*(int *)(in_RDI + 0xe4) == 1) {
    local_348 = in_RCX;
    memcpy(local_3d0,in_RCX,0x40);
    local_3c8 = *(undefined8 *)((long)local_348 + 0x10);
    if (*(int *)(in_RDI + 0xe8) == 0) {
      copy_make_border(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                       (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                       (int)in_stack_fffffffffffff9e0,
                       (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                       (int)in_stack_fffffffffffff9d8,in_stack_fffffffffffffa00,
                       (float)((ulong)in_stack_fffffffffffff9d0 >> 0x20),in_stack_fffffffffffffa08);
    }
    if (*(int *)(in_RDI + 0xe8) == 1) {
      copy_make_border(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                       (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                       (int)in_stack_fffffffffffff9e0,
                       (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                       (int)in_stack_fffffffffffff9d8,in_stack_fffffffffffffa00,
                       (float)((ulong)in_stack_fffffffffffff9d0 >> 0x20),in_stack_fffffffffffffa08);
    }
    if (*(int *)(in_RDI + 0xe8) == 2) {
      copy_make_border(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                       (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20),
                       (int)in_stack_fffffffffffff9e0,
                       (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                       (int)in_stack_fffffffffffff9d8,in_stack_fffffffffffffa00,
                       (float)((ulong)in_stack_fffffffffffff9d0 >> 0x20),in_stack_fffffffffffffa08);
    }
  }
  local_3e0 = local_364;
  local_3e4 = (local_364 - *(int *)(in_RDI + 0xd0)) / *(int *)(in_RDI + 0xd8) + 1;
  local_3e8 = *(int *)(in_RDI + 0xd0) / 2 + 1;
  local_55c = local_3e8;
  if (*(int *)(in_RDI + 0xf0) == 0) {
    local_55c = *(int *)(in_RDI + 0xd0);
  }
  local_3ec = local_55c;
  local_3f8 = local_380;
  if (*(int *)(in_RDI + 0xd4) == 0) {
    Mat::create(in_stack_fffffffffffff9d0,(int)((ulong)in_stack_fffffffffffff9c8 >> 0x20),
                (int)in_stack_fffffffffffff9c8,(int)((ulong)in_stack_fffffffffffff9c0 >> 0x20),
                in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b0);
  }
  else {
    Mat::create(in_stack_fffffffffffff9c0,(int)(in_stack_fffffffffffff9b8 >> 0x20),
                (int)in_stack_fffffffffffff9b8,(size_t)in_stack_fffffffffffff9b0,
                in_stack_fffffffffffff9a8);
  }
  local_300 = local_340;
  bVar2 = true;
  if (*local_340 != 0) {
    local_1e8 = local_340;
    bVar2 = local_340[8] * (long)(int)local_340[7] == 0;
  }
  if (bVar2) {
    local_324 = -100;
  }
  else {
    for (local_400 = 0; local_400 < local_3e8; local_400 = local_400 + 1) {
      local_2f0 = &local_390;
      local_459 = '\0';
      if (*(int *)(in_RDI + 0xd4) == 0) {
        local_2a8 = &local_458;
        local_1b4 = *(int *)((long)local_340 + 0x2c);
        local_1b8 = (int)local_340[6];
        local_1bc = *(undefined4 *)((long)local_340 + 0x34);
        local_5a0 = (float *)(*local_340 + local_340[8] * (long)local_400 * local_340[2]);
        local_1d0 = local_340[2];
        local_1d4 = (undefined4)local_340[3];
        local_1e0 = (long *)local_340[4];
        local_1b0 = &local_458;
        local_110 = (long)local_1b4 * (long)local_1b8 * local_1d0;
        local_418 = (local_110 + 0xfU & 0xfffffffffffffff0) / local_1d0;
        local_430 = (int)local_340[5] + -1;
        if ((int)local_340[5] == 4) {
          local_418 = (long)*(int *)((long)local_340 + 0x2c) * (long)(int)local_340[6];
        }
        local_424 = 1;
        local_114 = 0x10;
        local_2b4 = local_400;
        local_2b5 = 1;
        local_450 = (int *)0x0;
        local_459 = '\x01';
        local_318 = &local_458;
        local_1c8 = local_5a0;
        local_458 = local_5a0;
        local_448 = local_1d0;
        local_440 = local_1d4;
        local_438 = local_1e0;
        local_42c = local_1b4;
        local_428 = local_1b8;
        local_420 = local_1bc;
      }
      else {
        local_278 = local_340;
        local_27c = local_400;
        local_5a0 = (float *)(*local_340 +
                             (long)*(int *)((long)local_340 + 0x2c) * (long)local_400 * local_340[2]
                             );
      }
      local_408 = local_390;
      if (local_459 != '\0') {
        local_258 = &local_458;
        local_90 = local_258;
        if (local_450 != (int *)0x0) {
          local_94 = 0xffffffff;
          LOCK();
          local_98 = *local_450;
          *local_450 = *local_450 + -1;
          UNLOCK();
          if (local_98 == 1) {
            if (local_438 == (long *)0x0) {
              local_40 = local_458;
              if (local_458 != (float *)0x0) {
                free(local_458);
              }
            }
            else {
              (**(code **)(*local_438 + 0x18))(local_438,local_458);
            }
          }
        }
        local_458 = (float *)0x0;
        local_448 = 0;
        local_440 = 0;
        local_430 = 0;
        local_42c = 0;
        local_428 = 0;
        local_424 = 0;
        local_420 = 0;
        local_418 = 0;
        local_450 = (int *)0x0;
      }
      local_410 = local_5a0;
      for (local_460 = 0; local_460 < local_3e4; local_460 = local_460 + 1) {
        local_464 = 0.0;
        local_468 = 0.0;
        for (local_46c = 0; local_46c < *(int *)(in_RDI + 0xd0); local_46c = local_46c + 1) {
          local_200 = (long *)(in_RDI + 0xf8);
          local_208 = (long)local_46c;
          fVar3 = *(float *)(*local_200 + local_208 * 4) *
                  *(float *)((long)local_408 + (long)local_46c * 4);
          local_478 = ((double)local_400 * 6.283185307179586 * (double)local_46c) /
                      (double)*(int *)(in_RDI + 0xd0);
          local_470 = fVar3;
          fVar4 = cosf((float)local_478);
          fVar1 = local_470;
          local_464 = fVar3 * fVar4 + local_464;
          fVar3 = sinf((float)local_478);
          local_468 = local_468 - fVar1 * fVar3;
        }
        if (*(int *)(in_RDI + 0xec) == 1) {
          _Var5 = std::sqrt<int>(*(int *)(in_RDI + 0xd0));
          local_47c = (float)(1.0 / _Var5);
          local_464 = local_47c * local_464;
          local_468 = local_47c * local_468;
        }
        if (*(int *)(in_RDI + 0xec) == 2) {
          local_210 = (long *)(in_RDI + 0xf8);
          local_218 = (long)*(int *)(in_RDI + 0xd0);
          local_480 = *(float *)(*local_210 + local_218 * 4);
          local_464 = local_480 * local_464;
          local_468 = local_480 * local_468;
        }
        if (*(int *)(in_RDI + 0xd4) == 0) {
          *local_410 = local_464;
          local_410[1] = local_468;
          local_410 = local_410 + 2;
        }
        if (*(int *)(in_RDI + 0xd4) == 1) {
          dVar6 = std::sqrt((double)(ulong)(uint)(local_464 * local_464 + local_468 * local_468));
          *local_410 = SUB84(dVar6,0);
          local_410 = local_410 + 1;
        }
        if (*(int *)(in_RDI + 0xd4) == 2) {
          *local_410 = local_464 * local_464 + local_468 * local_468;
          local_410 = local_410 + 1;
        }
        local_408 = (void *)((long)local_408 + (long)*(int *)(in_RDI + 0xd8) * 4);
      }
    }
    if (*(int *)(in_RDI + 0xf0) == 0) {
      for (local_484 = local_3e8; local_484 < *(int *)(in_RDI + 0xd0); local_484 = local_484 + 1) {
        if (*(int *)(in_RDI + 0xd4) == 0) {
          local_2cc = *(int *)(in_RDI + 0xd0) - local_484;
          local_2c0 = &local_4d8;
          local_17c = *(int *)((long)local_340 + 0x2c);
          local_180 = (int)local_340[6];
          local_184 = *(undefined4 *)((long)local_340 + 0x34);
          local_190 = (undefined4 *)(*local_340 + local_340[8] * (long)local_2cc * local_340[2]);
          local_198 = local_340[2];
          local_19c = (undefined4)local_340[3];
          local_1a8 = local_340[4];
          local_178 = &local_4d8;
          local_120 = (long)local_17c * (long)local_180 * local_198;
          local_2f8 = &local_4d8;
          local_248 = &local_4d8;
          local_2d8 = &local_528;
          local_144 = *(int *)((long)local_340 + 0x2c);
          local_148 = (int)local_340[6];
          local_14c = *(undefined4 *)((long)local_340 + 0x34);
          local_158 = (undefined4 *)(*local_340 + local_340[8] * (long)local_484 * local_340[2]);
          local_160 = local_340[2];
          local_164 = (undefined4)local_340[3];
          local_170 = local_340[4];
          local_140 = &local_528;
          local_130 = (long)local_144 * (long)local_148 * local_160;
          local_320 = &local_528;
          local_238 = &local_528;
          local_4a0 = 0;
          local_4a4 = 0;
          local_4a8 = 0;
          local_4ac = 0;
          local_4c0 = 0;
          local_4c8 = 0;
          local_4d0 = 0;
          local_4d8 = 0;
          local_124 = 0x10;
          local_134 = 0x10;
          local_2cd = 1;
          local_2e4 = local_484;
          local_2e5 = 1;
          local_498 = 0;
          local_4b0 = 0;
          local_528 = 0;
          local_518 = 0;
          local_510 = 0;
          local_500 = 0;
          local_4fc = 0;
          local_4f8 = 0;
          local_4f4 = 0;
          local_4f0 = 0;
          local_4e8 = 0;
          local_520 = 0;
          local_4e0 = local_158;
          local_490 = local_190;
          for (local_52c = 0; local_d0 = local_238, local_b0 = local_248, local_508 = local_170,
              local_4b8 = local_1a8, local_52c < local_3e4; local_52c = local_52c + 1) {
            *local_4e0 = *local_490;
            local_4e0[1] = local_490[1] ^ 0x80000000;
            local_490 = local_490 + 2;
            local_4e0 = local_4e0 + 2;
          }
        }
        else {
          local_28c = *(int *)(in_RDI + 0xd0) - local_484;
          local_288 = local_340;
          local_298 = local_340;
          local_29c = local_484;
          memcpy((void *)(*local_340 +
                         (long)*(int *)((long)local_340 + 0x2c) * (long)local_484 * local_340[2]),
                 (void *)(*local_340 +
                         (long)*(int *)((long)local_340 + 0x2c) * (long)local_28c * local_340[2]),
                 (long)local_3e4 << 2);
        }
      }
    }
    local_324 = 0;
  }
  local_3fc = 1;
  ppvVar7 = &local_390;
  if (local_388 != (int *)0x0) {
    local_f4 = 0xffffffff;
    LOCK();
    local_f8 = *local_388;
    *local_388 = *local_388 + -1;
    UNLOCK();
    if (local_f8 == 1) {
      local_228 = ppvVar7;
      local_f0 = ppvVar7;
      if (local_370 == (long *)0x0) {
        local_10 = local_390;
        if (local_390 != (void *)0x0) {
          free(local_390);
        }
      }
      else {
        (**(code **)(*local_370 + 0x18))(local_370,local_390);
      }
    }
  }
  *ppvVar7 = (void *)0x0;
  ppvVar7[2] = (void *)0x0;
  *(undefined4 *)(ppvVar7 + 3) = 0;
  *(undefined4 *)(ppvVar7 + 5) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x2c) = 0;
  *(undefined4 *)(ppvVar7 + 6) = 0;
  *(undefined4 *)((long)ppvVar7 + 0x34) = 0;
  *(undefined4 *)(ppvVar7 + 7) = 0;
  ppvVar7[8] = (void *)0x0;
  ppvVar7[1] = (void *)0x0;
  return local_324;
}

Assistant:

int Spectrogram::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // https://pytorch.org/audio/stable/generated/torchaudio.functional.spectrogram.html

    // TODO custom window

    Mat bottom_blob_bordered = bottom_blob;
    if (center == 1)
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        if (pad_type == 0)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_CONSTANT, 0.f, opt_b);
        if (pad_type == 1)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_REPLICATE, 0.f, opt_b);
        if (pad_type == 2)
            copy_make_border(bottom_blob, bottom_blob_bordered, 0, 0, n_fft / 2, n_fft / 2, BORDER_REFLECT, 0.f, opt_b);
    }

    const int size = bottom_blob_bordered.w;

    // const int frames = size / hoplen + 1;
    const int frames = (size - n_fft) / hoplen + 1;
    const int freqs_onesided = n_fft / 2 + 1;
    const int freqs = onesided ? freqs_onesided : n_fft;

    const size_t elemsize = bottom_blob_bordered.elemsize;

    if (power == 0)
    {
        top_blob.create(2, frames, freqs, elemsize, opt.blob_allocator);
    }
    else
    {
        top_blob.create(frames, freqs, elemsize, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < freqs_onesided; i++)
    {
        const float* ptr = bottom_blob_bordered;
        float* outptr = power == 0 ? top_blob.channel(i) : top_blob.row(i);

        for (int j = 0; j < frames; j++)
        {
            float re = 0.f;
            float im = 0.f;
            for (int k = 0; k < n_fft; k++)
            {
                float v = ptr[k];

                // apply window
                v *= window_data[k];

                // dft
                double angle = 2 * 3.14159265358979323846 * i * k / n_fft;

                re += v * cosf(angle); // + imag * sinf(angle);
                im -= v * sinf(angle); // + imag * cosf(angle);
            }

            if (normalized == 1)
            {
                float norm = 1.f / sqrt(n_fft);
                re *= norm;
                im *= norm;
            }
            if (normalized == 2)
            {
                float norm = window_data[n_fft];
                re *= norm;
                im *= norm;
            }

            if (power == 0)
            {
                // complex as real
                outptr[0] = re;
                outptr[1] = im;
                outptr += 2;
            }
            if (power == 1)
            {
                // magnitude
                outptr[0] = sqrt(re * re + im * im);
                outptr += 1;
            }
            if (power == 2)
            {
                outptr[0] = re * re + im * im;
                outptr += 1;
            }

            ptr += hoplen;
        }
    }

    if (!onesided)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = freqs_onesided; i < n_fft; i++)
        {
            if (power == 0)
            {
                const float* ptr = top_blob.channel(n_fft - i);
                float* outptr = top_blob.channel(i);

                for (int j = 0; j < frames; j++)
                {
                    // complex as real
                    outptr[0] = ptr[0];
                    outptr[1] = -ptr[1];
                    ptr += 2;
                    outptr += 2;
                }
            }
            else // if (power == 1 || power == 2)
            {
                const float* ptr = top_blob.row(n_fft - i);
                float* outptr = top_blob.row(i);

                memcpy(outptr, ptr, frames * sizeof(float));
            }
        }
    }

    return 0;
}